

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.h
# Opt level: O2

bool __thiscall mjs::native_object::do_native_put(native_object *this,string *name,value *val)

{
  bool bVar1;
  native_object_property *pnVar2;
  wstring_view local_28;
  
  local_28 = string::view(name);
  pnVar2 = find(this,&local_28);
  if (pnVar2 != (native_object_property *)0x0) {
    bVar1 = has_attributes(pnVar2->attributes,read_only);
    if (!bVar1) {
      (*pnVar2->put)(this,val);
    }
  }
  return pnVar2 != (native_object_property *)0x0;
}

Assistant:

bool do_native_put(const string& name, const value& val) {
        if (auto it = find(name.view())) {
            if (!has_attributes(it->attributes, property_attribute::read_only)) {
                it->put(*this, val);
            }
            return true;
        } else {
            return false;
        }
    }